

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O2

void __thiscall
icu_63::anon_unknown_0::MutableCodePointTrie::setRange
          (MutableCodePointTrie *this,UChar32 start,UChar32 end,uint32_t value,UErrorCode *errorCode
          )

{
  uint32_t *puVar1;
  bool bVar2;
  uint uVar3;
  uint32_t *puVar4;
  UErrorCode UVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  
  if (U_ZERO_ERROR < *errorCode) {
    return;
  }
  UVar5 = U_ILLEGAL_ARGUMENT_ERROR;
  if (((start <= end) && ((uint)start < 0x110000)) && ((uint)end < 0x110000)) {
    bVar2 = ensureHighStart(this,end);
    UVar5 = U_MEMORY_ALLOCATION_ERROR;
    if (bVar2) {
      uVar9 = end + 1;
      uVar7 = start & 0xf;
      if (uVar7 != 0) {
        uVar3 = getDataBlock(this,(uint)start >> 4);
        if ((int)uVar3 < 0) {
          UVar5 = U_MEMORY_ALLOCATION_ERROR;
          goto LAB_002a4cf8;
        }
        start = start + 0xfU & 0x3ffff0;
        puVar1 = this->data;
        if (uVar9 < (uint)start) {
          for (puVar4 = puVar1 + (ulong)uVar3 + (ulong)uVar7;
              puVar4 < puVar1 + (ulong)uVar3 + (ulong)(uVar9 & 0xf); puVar4 = puVar4 + 1) {
            *puVar4 = value;
          }
          return;
        }
        for (uVar8 = (ulong)(uVar7 << 2); uVar8 < 0x40; uVar8 = uVar8 + 4) {
          *(uint32_t *)((long)puVar1 + uVar8 + (ulong)uVar3 * 4) = value;
        }
      }
      puVar1 = this->index;
      puVar4 = this->data;
      for (uVar8 = (ulong)(uint)start; (int)(uint)uVar8 < (int)(uVar9 & 0x3ffff0);
          uVar8 = uVar8 + 0x10) {
        uVar6 = uVar8 >> 4;
        if (this->flags[uVar6] == '\0') {
          puVar1[uVar6] = value;
        }
        else {
          uVar7 = puVar1[uVar6];
          for (uVar6 = 0; uVar6 < 0x40; uVar6 = uVar6 + 4) {
            *(uint32_t *)((long)puVar4 + uVar6 + (ulong)uVar7 * 4) = value;
          }
        }
      }
      if ((uVar9 & 0xf) == 0) {
        return;
      }
      uVar7 = getDataBlock(this,(uint)uVar8 >> 4);
      UVar5 = U_MEMORY_ALLOCATION_ERROR;
      if (-1 < (int)uVar7) {
        puVar4 = this->data + uVar7;
        puVar1 = puVar4 + (uVar9 & 0xf);
        for (; puVar4 < puVar1; puVar4 = puVar4 + 1) {
          *puVar4 = value;
        }
        return;
      }
    }
  }
LAB_002a4cf8:
  *errorCode = UVar5;
  return;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }